

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

void curl_mime_free(curl_mime *mime)

{
  curl_mimepart *pcVar1;
  curl_mime *mime_1;
  
  if (mime != (curl_mime *)0x0) {
    pcVar1 = mime->parent;
    if (pcVar1 != (curl_mimepart *)0x0) {
      pcVar1->readfunc = (curl_read_callback)0x0;
      pcVar1->seekfunc = (curl_seek_callback)0x0;
      pcVar1->freefunc = (curl_free_callback)0x0;
      pcVar1->arg = pcVar1;
      pcVar1->data = (char *)0x0;
      pcVar1->fp = (FILE *)0x0;
      pcVar1->datasize = 0;
      (pcVar1->encstate).pos = 0;
      (pcVar1->encstate).bufbeg = 0;
      (pcVar1->encstate).bufend = 0;
      pcVar1->kind = MIMEKIND_NONE;
      mime->parent = (curl_mimepart *)0x0;
    }
    pcVar1 = mime->firstpart;
    while (pcVar1 != (curl_mimepart *)0x0) {
      mime->firstpart = pcVar1->nextpart;
      Curl_mime_cleanpart(pcVar1);
      (*Curl_cfree)(pcVar1);
      pcVar1 = mime->firstpart;
    }
    (*Curl_cfree)(mime->boundary);
    (*Curl_cfree)(mime);
    return;
  }
  return;
}

Assistant:

void curl_mime_free(curl_mime *mime)
{
  curl_mimepart *part;

  if(mime) {
    mime_subparts_unbind(mime);  /* Be sure it's not referenced anymore. */
    while(mime->firstpart) {
      part = mime->firstpart;
      mime->firstpart = part->nextpart;
      Curl_mime_cleanpart(part);
      free(part);
    }

    free(mime->boundary);
    free(mime);
  }
}